

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::GetColorCode_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this,Color color)

{
  pointer pPVar1;
  allocator<char> local_6d [13];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Color local_1c;
  cmCTest *pcStack_18;
  Color color_local;
  cmCTest *this_local;
  
  local_1c = color;
  pcStack_18 = this;
  this_local = (cmCTest *)__return_storage_ptr__;
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar1->OutputColorCode & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_6d)
    ;
    std::allocator<char>::~allocator(local_6d);
  }
  else {
    std::__cxx11::to_string(&local_60,local_1c);
    std::operator+(&local_40,"\x1b[0;",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"m");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetColorCode(Color color) const
{
  if (this->Impl->OutputColorCode) {
    return "\033[0;" + std::to_string(static_cast<int>(color)) + "m";
  }

  return "";
}